

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

float Cipher::findBestCutoffFreq
                (TWaveformF *waveform,EAudioFilter filterId,int64_t sampleRate,
                float minCutoffFreq_Hz,float maxCutoffFreq_Hz,float step_Hz)

{
  double dVar1;
  bool bVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float freqCutoff_Hz;
  float local_274;
  double local_270;
  TWaveformI16 waveformInput;
  TSimilarityMap similarityMap;
  TWaveformViewT<short> local_218;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined4 local_1f4;
  _Vector_base<int,_std::allocator<int>_> local_1f0;
  TWaveformI16 waveformThreshold;
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1c0;
  TKeyPressCollectionI16 keyPresses;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> clusteringsCur;
  TWaveformF waveformFiltered;
  TWaveformI16 waveformMax;
  
  local_270 = -10000000000.0;
  freqCutoff_Hz = minCutoffFreq_Hz;
  local_274 = minCutoffFreq_Hz;
  while( true ) {
    if (maxCutoffFreq_Hz < freqCutoff_Hz) {
      return local_274;
    }
    waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               &waveformFiltered.super__Vector_base<float,_std::allocator<float>_>,waveform);
    filter<float>((TWaveformT<float> *)
                  &waveformFiltered.super__Vector_base<float,_std::allocator<float>_>,filterId,
                  freqCutoff_Hz,sampleRate);
    bVar2 = convert<float,short>
                      ((TWaveformT<float> *)
                       &waveformFiltered.super__Vector_base<float,_std::allocator<float>_>,
                       &waveformInput);
    if (bVar2) {
      keyPresses.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      keyPresses._20_8_ = 0;
      waveformMax.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      keyPresses.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      keyPresses.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      keyPresses.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      waveformMax.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      waveformMax.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_218.n = (long)waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start >> 1;
      local_218.samples =
           waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
      bVar2 = findKeyPresses<short>
                        (&local_218,&keyPresses,
                         (TWaveformT<short> *)
                         &waveformThreshold.super__Vector_base<short,_std::allocator<short>_>,
                         (TWaveformT<short> *)&waveformMax,8.0,0x200,0x800,true);
      if (!bVar2) {
        fprintf(_stderr,"%s:%d: findKeyPresses() failed\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                ,0x520);
      }
      std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                (&waveformThreshold.super__Vector_base<short,_std::allocator<short>_>);
      std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                ((_Vector_base<short,_std::allocator<short>_> *)&waveformMax);
      if (bVar2) {
        similarityMap.
        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        similarityMap.
        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        similarityMap.
        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = calculateSimilartyMap<short>(0x200,0x80,0x180,&keyPresses,&similarityMap);
        if (bVar2) {
          waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(waveformThreshold.super__Vector_base<short,_std::allocator<short>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)waveformThreshold.super__Vector_base<short,_std::allocator<short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffff00000000);
          local_1c0._M_buckets = &local_1c0._M_single_bucket;
          local_1c0._M_bucket_count = 1;
          local_1c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_1c0._M_element_count = 0;
          local_1c0._M_rehash_policy._M_max_load_factor = 1.0;
          local_1c0._M_rehash_policy._M_next_resize = 0;
          local_1c0._M_single_bucket = (__node_base_ptr)0x0;
          Processor::Processor((Processor *)&waveformMax);
          local_208 = 0x3ff0000000000000;
          local_200 = 0x3f73333338d1b717;
          local_1f4 = 500;
          local_1f0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1f0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1f0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_218.samples = (pointer)0x3200000017;
          local_218.n = 0x64000003e8;
          local_1f8 = 0x41a00000;
          Processor::init((Processor *)&waveformMax,(EVP_PKEY_CTX *)&local_218);
          Processor::getClusterings(&clusteringsCur,(Processor *)&waveformMax,1);
          dVar1 = (clusteringsCur.
                   super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
                   super__Vector_impl_data._M_start)->pClusters;
          fVar3 = freqCutoff_Hz;
          if (dVar1 <= local_270) {
            fVar3 = local_274;
          }
          uVar4 = SUB84(dVar1,0);
          uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
          if (dVar1 <= local_270) {
            uVar4 = SUB84(local_270,0);
            uVar5 = (undefined4)((ulong)local_270 >> 0x20);
          }
          local_270 = (double)CONCAT44(uVar5,uVar4);
          printf("    [findBestCutoffFreq] freqCutoff_Hz = %g, pClusters = %g\n",
                 SUB84((double)freqCutoff_Hz,0));
          std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::~vector(&clusteringsCur);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1f0);
          Processor::~Processor((Processor *)&waveformMax);
          std::
          _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_1c0);
          local_274 = fVar3;
        }
        else {
          fprintf(_stderr,"%s:%d: calculateSimilartyMap() failed\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                  ,0x527);
        }
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::~vector(&similarityMap);
      }
      else {
        bVar2 = false;
      }
      std::_Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
      ~_Vector_base((_Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                    &keyPresses);
    }
    else {
      bVar2 = false;
      fprintf(_stderr,"%s:%d: convert() failed\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
              ,0x516);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&waveformFiltered.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
              (&waveformInput.super__Vector_base<short,_std::allocator<short>_>);
    if (bVar2 == false) break;
    freqCutoff_Hz = freqCutoff_Hz + step_Hz;
  }
  return minCutoffFreq_Hz;
}

Assistant:

float findBestCutoffFreq(const TWaveformF & waveform, EAudioFilter filterId, int64_t sampleRate, float minCutoffFreq_Hz, float maxCutoffFreq_Hz, float step_Hz) {
        double pClustersBest = -1e10;
        float freqCutoffBest_Hz = minCutoffFreq_Hz;

        for (float freqCutoff_Hz = minCutoffFreq_Hz; freqCutoff_Hz <= maxCutoffFreq_Hz; freqCutoff_Hz += step_Hz) {
            TWaveformI16 waveformInput;
            TWaveformF waveformFiltered = waveform;
            filter(waveformFiltered, (EAudioFilter) filterId, freqCutoff_Hz, sampleRate);

            if (convert(waveformFiltered, waveformInput) == false) {
                fprintf(stderr, "%s:%d: convert() failed\n", __FILE__, __LINE__);
                return minCutoffFreq_Hz;
            }

            TKeyPressCollectionI16 keyPresses;
            {
                TWaveformI16 waveformMax;
                TWaveformI16 waveformThreshold;
                if (findKeyPresses(getView(waveformInput, 0), keyPresses, waveformThreshold, waveformMax,
                                   kFindKeysThreshold, kFindKeysHistorySize, kFindKeysHistorySizeReset, kFindKeysRemoveLowPower) == false) {
                    fprintf(stderr, "%s:%d: findKeyPresses() failed\n", __FILE__, __LINE__);
                    return minCutoffFreq_Hz;
                }
            }

            TSimilarityMap similarityMap;
            if (calculateSimilartyMap(kKeyWidth_samples, kKeyAlign_samples, kKeyWidth_samples - kKeyOffset_samples, keyPresses, similarityMap) == false) {
                fprintf(stderr, "%s:%d: calculateSimilartyMap() failed\n", __FILE__, __LINE__);
                return minCutoffFreq_Hz;
            }

            {
                Cipher::TFreqMap freqMap; // not used for anything
                Cipher::Processor processor;

                Cipher::TParameters params;
                params.maxClusters = 50;
                params.wEnglishFreq = 20.0;
                processor.init(params, freqMap, similarityMap);

                auto clusteringsCur = processor.getClusterings(1);
                if (clusteringsCur[0].pClusters > pClustersBest) {
                    pClustersBest = clusteringsCur[0].pClusters;
                    freqCutoffBest_Hz = freqCutoff_Hz;
                }
                printf("    [findBestCutoffFreq] freqCutoff_Hz = %g, pClusters = %g\n", freqCutoff_Hz, clusteringsCur[0].pClusters);
            }
        }

        return freqCutoffBest_Hz;
    }